

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_sse2.hpp
# Opt level: O0

float xsimd::kernel::reduce_add<xsimd::sse2>
                (batch<float,_xsimd::sse2> *self,requires_arch<sse2> param_2)

{
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  register_type afVar1;
  __m128 tmp1;
  __m128 tmp0;
  requires_arch<sse2> param_1_local;
  batch<float,_xsimd::sse2> *self_local;
  undefined4 local_68;
  undefined4 uStack_64;
  
  afVar1 = types::simd_register::operator_cast_to_function_pointer((simd_register *)self);
  types::simd_register::operator_cast_to_function_pointer((simd_register *)self);
  types::simd_register::operator_cast_to_function_pointer((simd_register *)self);
  local_68 = afVar1[0];
  uStack_64 = afVar1[1];
  return local_68 + extraout_XMM0_Dc + uStack_64 + extraout_XMM0_Dd;
}

Assistant:

inline float reduce_add(batch<float, A> const& self, requires_arch<sse2>) noexcept
        {
            __m128 tmp0 = _mm_add_ps(self, _mm_movehl_ps(self, self));
            __m128 tmp1 = _mm_add_ss(tmp0, _mm_shuffle_ps(tmp0, tmp0, 1));
            return _mm_cvtss_f32(tmp1);
        }